

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChunkV.cpp
# Opt level: O1

size_t __thiscall
adios2::format::ChunkV::AddToVec
          (ChunkV *this,size_t size,void *buf,size_t align,bool CopyReqd,MemorySpace MemSpace)

{
  size_t *psVar1;
  pointer *ppVVar2;
  pointer *ppCVar3;
  pointer pVVar4;
  size_t sVar5;
  iterator __position;
  pointer pCVar6;
  iterator __position_00;
  size_t sVar7;
  size_t sVar8;
  ulong size_00;
  Chunk *v;
  bool bVar9;
  VecEntry entry;
  Chunk c;
  VecEntry local_78;
  size_t *local_58;
  void *local_50;
  Chunk local_48;
  
  BufferV::AlignBuffer(&this->super_BufferV,align);
  sVar8 = (this->super_BufferV).CurOffset;
  if (size == 0) {
    return sVar8;
  }
  if ((CopyReqd) || ((this->super_BufferV).m_AlwaysCopy != false)) {
    pVVar4 = (this->super_BufferV).DataV.
             super__Vector_base<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((pVVar4 == (this->super_BufferV).DataV.
                   super__Vector_base<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start) || (pVVar4[-1].External != false)) {
      bVar9 = false;
    }
    else {
      bVar9 = this->m_TailChunk->Ptr + (this->m_TailChunkPos - pVVar4[-1].Size) ==
              (char *)pVVar4[-1].Base;
    }
    if ((bVar9) && (this->m_ChunkSize < this->m_TailChunkPos + size)) {
      local_58 = &this->m_TailChunkPos;
      v = (this->m_Chunks).
          super__Vector_base<adios2::format::ChunkV::Chunk,_std::allocator<adios2::format::ChunkV::Chunk>_>
          ._M_impl.super__Vector_impl_data._M_finish + -1;
      local_50 = buf;
      sVar7 = ChunkAlloc(this,v,this->m_TailChunkPos);
      sVar5 = this->m_TailChunkPos;
      if (sVar7 - sVar5 != 0) {
        memset(v->Ptr + sVar5,0,sVar7 - sVar5);
      }
      sVar8 = (sVar7 + sVar8) - sVar5;
      pVVar4 = (this->super_BufferV).DataV.
               super__Vector_base<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pVVar4[-1].Size = sVar7;
      pVVar4[-1].Base = v->Ptr;
      *local_58 = 0;
      local_58[1] = 0;
      bVar9 = false;
      buf = local_50;
    }
    if (bVar9) {
      memcpy(this->m_TailChunk->Ptr + this->m_TailChunkPos,buf,size);
      psVar1 = &(this->super_BufferV).DataV.
                super__Vector_base<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].Size;
      *psVar1 = *psVar1 + size;
      this->m_TailChunkPos = this->m_TailChunkPos + size;
      goto LAB_004ad9a1;
    }
    size_00 = this->m_ChunkSize;
    if (this->m_ChunkSize <= size) {
      size_00 = size;
    }
    local_48.Ptr = (char *)0x0;
    local_48.AllocatedPtr = (void *)0x0;
    local_48.Size = 0;
    ChunkAlloc(this,&local_48,size_00);
    __position._M_current =
         (this->m_Chunks).
         super__Vector_base<adios2::format::ChunkV::Chunk,_std::allocator<adios2::format::ChunkV::Chunk>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->m_Chunks).
        super__Vector_base<adios2::format::ChunkV::Chunk,_std::allocator<adios2::format::ChunkV::Chunk>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<adios2::format::ChunkV::Chunk,std::allocator<adios2::format::ChunkV::Chunk>>::
      _M_realloc_insert<adios2::format::ChunkV::Chunk_const&>
                ((vector<adios2::format::ChunkV::Chunk,std::allocator<adios2::format::ChunkV::Chunk>>
                  *)&this->m_Chunks,__position,&local_48);
    }
    else {
      (__position._M_current)->Size = local_48.Size;
      (__position._M_current)->Ptr = local_48.Ptr;
      (__position._M_current)->AllocatedPtr = local_48.AllocatedPtr;
      ppCVar3 = &(this->m_Chunks).
                 super__Vector_base<adios2::format::ChunkV::Chunk,_std::allocator<adios2::format::ChunkV::Chunk>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppCVar3 = *ppCVar3 + 1;
    }
    pCVar6 = (this->m_Chunks).
             super__Vector_base<adios2::format::ChunkV::Chunk,_std::allocator<adios2::format::ChunkV::Chunk>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    this->m_TailChunk = pCVar6 + -1;
    memcpy(pCVar6[-1].Ptr,buf,size);
    this->m_TailChunkPos = size;
    local_78.External = false;
    local_78.Base = this->m_TailChunk->Ptr;
  }
  else {
    local_78.External = true;
    local_78.Base = buf;
  }
  local_78.Offset = 0;
  __position_00._M_current =
       (this->super_BufferV).DataV.
       super__Vector_base<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position_00._M_current ==
      (this->super_BufferV).DataV.
      super__Vector_base<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_78.Size = size;
    std::vector<adios2::format::BufferV::VecEntry,std::allocator<adios2::format::BufferV::VecEntry>>
    ::_M_realloc_insert<adios2::format::BufferV::VecEntry_const&>
              ((vector<adios2::format::BufferV::VecEntry,std::allocator<adios2::format::BufferV::VecEntry>>
                *)&(this->super_BufferV).DataV,__position_00,&local_78);
  }
  else {
    (__position_00._M_current)->Offset = 0;
    (__position_00._M_current)->Size = size;
    *(ulong *)__position_00._M_current = CONCAT71(local_78._1_7_,local_78.External);
    (__position_00._M_current)->Base = local_78.Base;
    ppVVar2 = &(this->super_BufferV).DataV.
               super__Vector_base<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppVVar2 = *ppVVar2 + 1;
  }
LAB_004ad9a1:
  (this->super_BufferV).CurOffset = size + sVar8;
  return sVar8;
}

Assistant:

size_t ChunkV::AddToVec(const size_t size, const void *buf, size_t align, bool CopyReqd,
                        MemorySpace MemSpace)
{
    AlignBuffer(align); // may call back AddToVec recursively
    size_t retOffset = CurOffset;

    if (size == 0)
    {
        return CurOffset;
    }

    /* std::cout << "  AddToVec: size = " << size << " copy = " << CopyReqd
              << std::endl; */
    if (!CopyReqd && !m_AlwaysCopy)
    {
        /*std::cout << "    add external = " << size << std::endl;*/
        // just add buf to internal version of output vector
        VecEntry entry = {true, buf, 0, size};
        DataV.push_back(entry);
    }
    else
    {
        // we can possibly append this entry to the last if the last was
        // internal
        bool AppendPossible =
            DataV.size() && !DataV.back().External &&
            (m_TailChunk->Ptr + m_TailChunkPos - DataV.back().Size == DataV.back().Base);

        if (AppendPossible && (m_TailChunkPos + size > m_ChunkSize))
        {
            // No room in current chunk, close it out
            // realloc down to used size (helpful?) and set size in array
            /*std::cout << "    downsize ptr = " << m_Chunks.back().Ptr
                      << " to size = " << m_TailChunkPos << std::endl;*/
            Chunk &c = m_Chunks.back();
            size_t actualsize = ChunkAlloc(c, m_TailChunkPos);
            size_t alignment = actualsize - m_TailChunkPos;
            if (alignment)
            {
                auto p = c.Ptr + m_TailChunkPos;
                std::fill(p, p + alignment, 0);
            }
            retOffset += alignment;
            // Update entry in DataV as size and potentiall ptr has changed
            // Learned from sanitizer: downsizing realloc still may change pointer
            VecEntry &dv = DataV.back();
            dv.Size = actualsize;
            dv.Base = c.Ptr;
            m_TailChunkPos = 0;
            m_TailChunk = nullptr;
            AppendPossible = false;
        }
        if (AppendPossible)
        {
            // We can use current chunk, just append the data;
            /*std::cout << "    append to current chunk ptr = "
                      << m_TailChunk->Ptr << " at pos = " << m_TailChunkPos
                      << " add size = " << size << std::endl; */
            CopyDataToBuffer(size, buf, m_TailChunkPos, MemSpace);
            DataV.back().Size += size;
            m_TailChunkPos += size;
        }
        else
        {
            // We need a new chunk, get the larger of size or m_ChunkSize
            /*  std::cout << "    get a new chunk size = " << m_ChunkSize
                      << std::endl; */
            size_t NewSize = m_ChunkSize;
            if (size > m_ChunkSize)
                NewSize = size;
            Chunk c{nullptr, nullptr, 0};
            ChunkAlloc(c, NewSize);
            m_Chunks.push_back(c);
            m_TailChunk = &m_Chunks.back();
            CopyDataToBuffer(size, buf, 0, MemSpace);
            m_TailChunkPos = size;
            VecEntry entry = {false, m_TailChunk->Ptr, 0, size};
            DataV.push_back(entry);
        }
    }
    CurOffset = retOffset + size;
    return retOffset;
}